

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

void __thiscall
kj::Canceler::AdapterImpl<unsigned_int>::cancel(AdapterImpl<unsigned_int> *this,Exception *e)

{
  PromiseFulfiller<unsigned_int> *pPVar1;
  Exception *pEVar2;
  Promise<void> local_28;
  Exception *local_18;
  Exception *e_local;
  AdapterImpl<unsigned_int> *this_local;
  
  pPVar1 = this->fulfiller;
  local_18 = e;
  e_local = (Exception *)this;
  pEVar2 = mv<kj::Exception>(e);
  (*pPVar1->_vptr_PromiseFulfiller[1])(pPVar1,pEVar2);
  Promise<void>::Promise(&local_28,(void *)0x0);
  Promise<void>::operator=(&this->inner,&local_28);
  Promise<void>::~Promise(&local_28);
  return;
}

Assistant:

void cancel(Exception&& e) override {
      fulfiller.reject(kj::mv(e));
      inner = nullptr;
    }